

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O2

void __thiscall
QtPrivate::QCalendarDateValidator::QCalendarDateValidator(QCalendarDateValidator *this)

{
  qint64 qVar1;
  
  (this->m_tokens).
  super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tokens).
  super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_separators).d.size = 0;
  (this->m_tokens).
  super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_separators).d.d = (Data *)0x0;
  (this->m_separators).d.ptr = (QString *)0x0;
  QCalendarYearValidator::QCalendarYearValidator(&this->m_yearValidator);
  QCalendarMonthValidator::QCalendarMonthValidator(&this->m_monthValidator);
  QCalendarDayValidator::QCalendarDayValidator(&this->m_dayValidator);
  this->m_currentToken = -1;
  qVar1 = QDate::currentDate();
  (this->m_initialDate).jd = qVar1;
  (this->m_currentDate).jd = qVar1;
  this->m_lastSectionMove = ThisSection;
  return;
}

Assistant:

QCalendarDateValidator::QCalendarDateValidator()
    : m_currentToken(-1),
      m_initialDate(QDate::currentDate()),
      m_currentDate(m_initialDate),
      m_lastSectionMove(QCalendarDateSectionValidator::ThisSection)
{
}